

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_singleton.h
# Opt level: O0

object_t<_zes_perf_handle_t_*> * __thiscall
singleton_factory_t<object_t<_zes_perf_handle_t*>,_zes_perf_handle_t*>::
getInstance<_zes_perf_handle_t*&,dditable_t*&>
          (singleton_factory_t<object_t<_zes_perf_handle_t*>,_zes_perf_handle_t*> *this,
          _zes_perf_handle_t **_params,dditable_t **_params_1)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false,_false>,_bool>
  pVar3;
  unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>
  local_60;
  __single_object ptr;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false>
  local_40;
  iterator iter;
  lock_guard<std::mutex> lk;
  key_t key;
  dditable_t **_params_local_1;
  _zes_perf_handle_t **_params_local;
  singleton_factory_t<object_t<_zes_perf_handle_t_*>,__zes_perf_handle_t_*> *this_local;
  
  lk._M_device = (mutex_type *)getKey<dditable_t*&>(this,*_params,_params_1);
  if (lk._M_device == (mutex_type *)0x0) {
    this_local = (singleton_factory_t<object_t<_zes_perf_handle_t_*>,__zes_perf_handle_t_*> *)0x0;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&iter,(mutex_type *)this);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>_>_>
         ::find((unordered_map<unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>_>_>
                 *)(this + 0x28),(key_type *)&lk);
    ptr._M_t.
    super___uniq_ptr_impl<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_object_t<_zes_perf_handle_t_*>_*,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>
    .super__Head_base<0UL,_object_t<_zes_perf_handle_t_*>_*,_false>._M_head_impl =
         (__uniq_ptr_data<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>,_true,_true>
          )std::
           unordered_map<unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>_>_>
           ::end((unordered_map<unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>_>_>
                  *)(this + 0x28));
    bVar1 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false>
                        *)&ptr,&local_40);
    if (bVar1) {
      std::make_unique<object_t<_zes_perf_handle_t*>,_zes_perf_handle_t*&,dditable_t*&>
                ((_zes_perf_handle_t **)&local_60,(dditable_t **)_params);
      pVar3 = std::
              unordered_map<unsigned_long,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>>>
              ::
              emplace<unsigned_long&,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>
                        ((unordered_map<unsigned_long,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>>>
                          *)(this + 0x28),(unsigned_long *)&lk,&local_60);
      local_40._M_cur =
           (__node_type *)
           pVar3.first.
           super__Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false>
           ._M_cur;
      std::
      unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>
      ::~unique_ptr(&local_60);
    }
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false,_false>
                           *)&local_40);
    this_local = (singleton_factory_t<object_t<_zes_perf_handle_t_*>,__zes_perf_handle_t_*> *)
                 std::
                 unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>
                 ::get(&ppVar2->second);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&iter);
  }
  return (object_t<_zes_perf_handle_t_*> *)this_local;
}

Assistant:

_singleton_t* getInstance( Ts&&... _params )
    {
        auto key = getKey( std::forward<Ts>( _params )... );

        if(key == 0) // No zero keys allowed in map
            return static_cast<_singleton_t*>(0);

        std::lock_guard<std::mutex> lk( mut );
        auto iter = map.find( key );

        if( map.end() == iter )
        {
            auto ptr = std::make_unique<singleton_t>( std::forward<Ts>( _params )... );
            iter = map.emplace( key, std::move( ptr ) ).first;
        }
        return iter->second.get();
    }